

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelmapped.h
# Opt level: O2

void __thiscall
TPZGeoElMapped<TPZGeoElRefPattern<pzgeom::TPZGeoCube>_>::TPZGeoElMapped
          (TPZGeoElMapped<TPZGeoElRefPattern<pzgeom::TPZGeoCube>_> *this)

{
  double local_20;
  
  *(undefined ***)
   &(this->super_TPZGeoElRefPattern<pzgeom::TPZGeoCube>).super_TPZGeoElRefLess<pzgeom::TPZGeoCube>.
    super_TPZGeoEl = &PTR__TPZSavable_01741548;
  TPZGeoElRefPattern<pzgeom::TPZGeoCube>::TPZGeoElRefPattern
            (&this->super_TPZGeoElRefPattern<pzgeom::TPZGeoCube>,&PTR_PTR_01740ad0);
  *(undefined ***)
   &(this->super_TPZGeoElRefPattern<pzgeom::TPZGeoCube>).super_TPZGeoElRefLess<pzgeom::TPZGeoCube>.
    super_TPZGeoEl = &PTR__TPZGeoElMapped_017407c0;
  local_20 = 0.0;
  TPZFNMatrix<24,_double>::TPZFNMatrix(&this->fCornerCo,3,8,&local_20);
  return;
}

Assistant:

TPZGeoElMapped() : TPZRegisterClassId(&TPZGeoElMapped::ClassId),
    TBase(), fCornerCo(Geo::Dimension,Geo::NNodes,0.)
	{
	}